

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_innerproduct_batchnorm(NetOptimize *this)

{
  float fVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference ppLVar5;
  reference pvVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float *pfVar9;
  reference pvVar10;
  Mat *pMVar11;
  reference pvVar12;
  int iVar13;
  long in_RDI;
  double dVar14;
  int top_blob_index_final;
  int j_1;
  float *conv_weight_outch;
  int i_2;
  float *bias;
  float *weight;
  int weight_per_outch;
  float sqrt_var;
  int i_1;
  vector<float,_std::allocator<float>_> b;
  vector<float,_std::allocator<float>_> a;
  float eps;
  int channels;
  BatchNorm *batchnorm;
  InnerProduct *innerproduct;
  int j;
  int top_blob_index;
  int i;
  int layer_count;
  Allocator *in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  float in_stack_fffffffffffffe68;
  value_type in_stack_fffffffffffffe6c;
  Mat *in_stack_fffffffffffffe70;
  float *in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  int local_f4;
  int local_e4;
  int local_80;
  vector<float,_std::allocator<float>_> local_78 [2];
  vector<float,_std::allocator<float>_> local_48;
  float local_30;
  int local_2c;
  value_type local_28;
  value_type local_20;
  int local_18;
  value_type local_14;
  int local_10;
  int local_c;
  
  sVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  local_c = (int)sVar4;
  local_10 = 0;
  do {
    if (local_c <= local_10) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_10);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                            (char *)in_stack_fffffffffffffe58);
    if (!bVar2) {
      ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_10);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar5)->tops,0);
      local_14 = *pvVar6;
      local_18 = local_10;
      do {
        do {
          do {
            local_18 = local_18 + 1;
            if (local_c <= local_18) goto LAB_00115d7b;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                       (long)local_18);
            bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60)
                                    ,(char *)in_stack_fffffffffffffe58);
          } while (bVar2);
          ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_18);
          sVar4 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar5)->bottoms);
        } while (sVar4 != 1);
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_18);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar5)->bottoms,0);
      } while (*pvVar6 != local_14);
LAB_00115d7b:
      if (local_18 != local_c) {
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_10);
        local_20 = *ppLVar5;
        ppLVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_18);
        __stream = _stderr;
        local_28 = *ppLVar5;
        uVar7 = std::__cxx11::string::c_str();
        uVar8 = std::__cxx11::string::c_str();
        fprintf(__stream,"fuse_innerproduct_batchnorm %s %s\n",uVar7,uVar8);
        local_2c = *(int *)&local_28[1]._vptr_Layer;
        local_30 = *(float *)((long)&local_28[1]._vptr_Layer + 4);
        std::allocator<float>::allocator((allocator<float> *)0x115e8c);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (size_type)in_stack_fffffffffffffe78,(allocator_type *)in_stack_fffffffffffffe70)
        ;
        std::allocator<float>::~allocator((allocator<float> *)0x115eb8);
        std::allocator<float>::allocator((allocator<float> *)0x115ed7);
        std::vector<float,_std::allocator<float>_>::vector
                  ((vector<float,_std::allocator<float>_> *)
                   CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   (size_type)in_stack_fffffffffffffe78,(allocator_type *)in_stack_fffffffffffffe70)
        ;
        std::allocator<float>::~allocator((allocator<float> *)0x115efd);
        for (local_80 = 0; local_80 < local_2c; local_80 = local_80 + 1) {
          pfVar9 = ncnn::Mat::operator[]((Mat *)&local_28[2].one_blob_only,local_80);
          dVar14 = std::sqrt((double)(ulong)(uint)(*pfVar9 + local_30));
          pfVar9 = ncnn::Mat::operator[]((Mat *)((long)&local_28[2].name.field_2 + 8),local_80);
          in_stack_fffffffffffffe84 = *pfVar9;
          pfVar9 = ncnn::Mat::operator[]((Mat *)&local_28[1].one_blob_only,local_80);
          fVar1 = *pfVar9;
          pfVar9 = ncnn::Mat::operator[]((Mat *)((long)&local_28[1].name.field_2 + 8),local_80);
          in_stack_fffffffffffffe84 =
               in_stack_fffffffffffffe84 - (fVar1 * *pfVar9) / SUB84(dVar14,0);
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](&local_48,(long)local_80)
          ;
          *pvVar10 = in_stack_fffffffffffffe84;
          pfVar9 = ncnn::Mat::operator[]((Mat *)&local_28[1].one_blob_only,local_80);
          in_stack_fffffffffffffe80 = *pfVar9 / SUB84(dVar14,0);
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](local_78,(long)local_80);
          *pvVar10 = in_stack_fffffffffffffe80;
        }
        if (*(int *)((long)&local_20[1]._vptr_Layer + 4) == 0) {
          *(undefined4 *)((long)&local_20[1]._vptr_Layer + 4) = 1;
          ncnn::Mat::Mat(in_stack_fffffffffffffe70,(int)in_stack_fffffffffffffe6c,
                         CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         in_stack_fffffffffffffe58);
          ncnn::Mat::operator=
                    ((Mat *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                     (Mat *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
          ncnn::Mat::~Mat((Mat *)0x116188);
          ncnn::Mat::fill(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c);
        }
        iVar3 = *(int *)&local_20[1].one_blob_only / local_2c;
        pfVar9 = ncnn::Mat::operator_cast_to_float_
                           ((Mat *)&local_20[1].bottoms.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish);
        in_stack_fffffffffffffe78 = pfVar9;
        pMVar11 = (Mat *)ncnn::Mat::operator_cast_to_float_
                                   ((Mat *)&local_20[2].type._M_string_length);
        in_stack_fffffffffffffe70 = pMVar11;
        for (local_e4 = 0; local_e4 < local_2c; local_e4 = local_e4 + 1) {
          iVar13 = iVar3 * local_e4;
          for (local_f4 = 0; local_f4 < iVar3; local_f4 = local_f4 + 1) {
            pvVar10 = std::vector<float,_std::allocator<float>_>::operator[]
                                (local_78,(long)local_e4);
            pfVar9[(long)iVar13 + (long)local_f4] = *pvVar10 * pfVar9[(long)iVar13 + (long)local_f4]
            ;
          }
          in_stack_fffffffffffffe68 = *(float *)((long)&pMVar11->data + (long)local_e4 * 4);
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](local_78,(long)local_e4);
          in_stack_fffffffffffffe6c = *pvVar10;
          pvVar10 = std::vector<float,_std::allocator<float>_>::operator[](&local_48,(long)local_e4)
          ;
          *(float *)((long)&pMVar11->data + (long)local_e4 * 4) =
               in_stack_fffffffffffffe68 * in_stack_fffffffffffffe6c + *pvVar10;
        }
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe70);
        std::vector<float,_std::allocator<float>_>::~vector
                  ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffe70);
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_28->tops,0);
        iVar3 = *pvVar6;
        in_stack_fffffffffffffe60 = iVar3;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_20->tops,0);
        *pvVar6 = in_stack_fffffffffffffe60;
        in_stack_fffffffffffffe64 = local_10;
        pvVar12 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            ((vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *)(in_RDI + 0x28),
                             (long)iVar3);
        pvVar12->producer = in_stack_fffffffffffffe64;
        std::__cxx11::string::operator=((string *)&local_28->type,"ncnnfused");
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_innerproduct_batchnorm()
{
    const int layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "InnerProduct")
            continue;

        // InnerProduct - BatchNorm
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "BatchNorm")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse InnerProduct - BatchNorm to InnerProduct
        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)layers[i];
        ncnn::BatchNorm* batchnorm = (ncnn::BatchNorm*)layers[j];

        fprintf(stderr, "fuse_innerproduct_batchnorm %s %s\n", innerproduct->name.c_str(), batchnorm->name.c_str());

        {
            int channels = batchnorm->channels;
            float eps = batchnorm->eps;

            // a = bias - slope * mean / sqrt(var + eps)
            // b = slope / sqrt(var + eps)
            // value = value * b + a

            std::vector<float> a(channels);
            std::vector<float> b(channels);
            for (int i=0; i<channels; i++)
            {
                float sqrt_var = sqrt(batchnorm->var_data[i] + eps);
                a[i] = batchnorm->bias_data[i] - batchnorm->slope_data[i] * batchnorm->mean_data[i] / sqrt_var;
                b[i] = batchnorm->slope_data[i] / sqrt_var;
            }

            if (innerproduct->bias_term == 0)
            {
                // init bias as zero
                innerproduct->bias_term = 1;
                innerproduct->bias_data = ncnn::Mat(channels);
                innerproduct->bias_data.fill(0.f);
            }

            const int weight_per_outch = innerproduct->weight_data_size / channels;

            float* weight = innerproduct->weight_data;
            float* bias = innerproduct->bias_data;
            for (int i=0; i<channels; i++)
            {
                float* conv_weight_outch = weight + weight_per_outch * i;
                for (int j=0; j<weight_per_outch; j++)
                {
                    conv_weight_outch[j] *= b[i];
                }

                bias[i] = bias[i] * b[i] + a[i];
            }
        }

        int top_blob_index_final = batchnorm->tops[0];
        innerproduct->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        batchnorm->type = "ncnnfused";
    }

    return 0;
}